

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntPrint(Vec_Int_t *vVec)

{
  uint uVar1;
  int i;
  
  printf("Vector has %d entries: {",(ulong)(uint)vVec->nSize);
  for (i = 0; i < vVec->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(vVec,i);
    printf(" %d",(ulong)uVar1);
  }
  puts(" }");
  return;
}

Assistant:

static inline void Vec_IntPrint( Vec_Int_t * vVec )
{
    int i, Entry;
    printf( "Vector has %d entries: {", Vec_IntSize(vVec) );
    Vec_IntForEachEntry( vVec, Entry, i )
        printf( " %d", Entry );
    printf( " }\n" );
}